

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_loop::translate
          (method_loop *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  element_type *this_00;
  statement_base *psVar1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffe28;
  compiler_type *in_stack_fffffffffffffe30;
  _Self *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 uVar2;
  element_type *in_stack_fffffffffffffe70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe78;
  statement_loop *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe98;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffea0;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffea8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffeb0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffee8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffef0;
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x55a95c);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x55a969);
  this_00 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x55a971);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin(in_stack_fffffffffffffe28);
  std::operator+(in_stack_fffffffffffffe38,(difference_type)in_stack_fffffffffffffe30);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end(in_stack_fffffffffffffe28);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x55a9d8
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  compiler_type::translate
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x55aa10);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)in_stack_fffffffffffffe80);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x55aa2c
            );
  psVar1 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffe30);
  uVar2 = 1;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)&stack0xfffffffffffffe70,
             (shared_ptr<cs::context_type> *)in_stack_fffffffffffffe28);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_00);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
  statement_loop::statement_loop
            (in_stack_fffffffffffffe80,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe78._M_pi,(context_t *)in_stack_fffffffffffffe70,
             (token_base *)CONCAT17(uVar2,in_stack_fffffffffffffe68));
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x55aaaa);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe80);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffe80);
  return psVar1;
}

Assistant:

statement_base *method_loop::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_loop(body, context, raw.front().back());
	}